

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_32e0b::CleanDeadTestCleanDead::Run(CleanDeadTestCleanDead *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  LoadStatus LVar4;
  int iVar5;
  reference ppEVar6;
  Entries *pEVar7;
  size_type sVar8;
  LogEntry *pLVar9;
  size_type sVar10;
  TimeStamp TVar11;
  reference pbVar12;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f8;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  undefined1 local_570 [8];
  Cleaner cleaner2;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  undefined1 local_460 [8];
  Cleaner cleaner1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  undefined1 local_350 [8];
  BuildLog log2;
  string local_2e0;
  undefined1 local_2c0 [8];
  string err;
  BuildLog log1;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  ManifestParserOptions local_144;
  int local_13c;
  undefined4 local_138;
  int fail_count_1;
  ManifestParserOptions local_124;
  int local_11c;
  undefined1 local_118 [4];
  int fail_count;
  State state;
  CleanDeadTestCleanDead *this_local;
  
  state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  State::State((State *)local_118);
  local_11c = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_124);
  AssertParse((State *)local_118,
              "rule cat\n  command = cat $in > $out\nbuild out1: cat in\nbuild out2: cat in\n",
              local_124);
  iVar5 = local_11c;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar5 == iVar3) {
    local_13c = testing::Test::AssertionFailures(g_current_test);
    ManifestParserOptions::ManifestParserOptions(&local_144);
    AssertParse(&(this->super_CleanDeadTest).super_CleanTest.super_StateTestWithBuiltinRules.state_,
                "build out2: cat in\n",local_144);
    iVar5 = local_13c;
    iVar3 = testing::Test::AssertionFailures(g_current_test);
    if (iVar5 == iVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"in",&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"",&local_191);
      VirtualFileSystem::Create
                (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_168,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"out1",&local_1b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",&local_1e1);
      VirtualFileSystem::Create
                (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_1b8,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"out2",&local_209);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"",(allocator<char> *)&log1.field_0x67);
      VirtualFileSystem::Create
                (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_208,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)&log1.field_0x67);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      BuildLog::BuildLog((BuildLog *)((long)&err.field_2 + 8));
      std::__cxx11::string::string((string *)local_2c0);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"CleanTest-tempfile",(allocator<char> *)&log2.field_0x67);
      bVar2 = BuildLog::OpenForWrite
                        ((BuildLog *)((long)&err.field_2 + 8),&local_2e0,
                         &(this->super_CleanDeadTest).super_BuildLogUser,(string *)local_2c0);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                 ,0x1f2,"log1.OpenForWrite(kTestFilename, *this, &err)");
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&log2.field_0x67);
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2c0);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                         ,499,"\"\" == err");
      if (bVar2) {
        ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                             &state.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
        BuildLog::RecordCommand((BuildLog *)((long)&err.field_2 + 8),*ppEVar6,0xf,0x12,0);
        ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                             &state.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
        BuildLog::RecordCommand((BuildLog *)((long)&err.field_2 + 8),*ppEVar6,0x14,0x19,0);
        BuildLog::Close((BuildLog *)((long)&err.field_2 + 8));
        BuildLog::BuildLog((BuildLog *)local_350);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,"CleanTest-tempfile",&local_371);
        LVar4 = BuildLog::Load((BuildLog *)local_350,&local_370,(string *)local_2c0);
        testing::Test::Check
                  (pTVar1,LVar4 != LOAD_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                   ,0x1f9,"log2.Load(kTestFilename, &err)");
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator(&local_371);
        pTVar1 = g_current_test;
        bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2c0);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x1fa,"\"\" == err");
        pTVar1 = g_current_test;
        if (bVar2) {
          pEVar7 = BuildLog::entries((BuildLog *)local_350);
          sVar8 = std::
                  unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
                  ::size(pEVar7);
          bVar2 = testing::Test::Check
                            (pTVar1,sVar8 == 2,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                             ,0x1fb,"2u == log2.entries().size()");
          pTVar1 = g_current_test;
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_398,"out1",&local_399);
            pLVar9 = BuildLog::LookupByOutput((BuildLog *)local_350,&local_398);
            bVar2 = testing::Test::Check
                              (pTVar1,pLVar9 != (LogEntry *)0x0,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                               ,0x1fc,"log2.LookupByOutput(\"out1\")");
            std::__cxx11::string::~string((string *)&local_398);
            std::allocator<char>::~allocator(&local_399);
            pTVar1 = g_current_test;
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3c0,"out2",(allocator<char> *)&cleaner1.field_0x97);
              pLVar9 = BuildLog::LookupByOutput((BuildLog *)local_350,&local_3c0);
              bVar2 = testing::Test::Check
                                (pTVar1,pLVar9 != (LogEntry *)0x0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                                 ,0x1fd,"log2.LookupByOutput(\"out2\")");
              std::__cxx11::string::~string((string *)&local_3c0);
              std::allocator<char>::~allocator((allocator<char> *)&cleaner1.field_0x97);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                Cleaner::Cleaner((Cleaner *)local_460,(State *)local_118,
                                 &(this->super_CleanDeadTest).super_CleanTest.config_,
                                 &(this->super_CleanDeadTest).super_CleanTest.fs_.
                                  super_DiskInterface);
                pTVar1 = g_current_test;
                pEVar7 = BuildLog::entries((BuildLog *)local_350);
                iVar5 = Cleaner::CleanDead((Cleaner *)local_460,pEVar7);
                testing::Test::Check
                          (pTVar1,iVar5 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x201,"0 == cleaner1.CleanDead(log2.entries())");
                pTVar1 = g_current_test;
                iVar5 = Cleaner::cleaned_files_count((Cleaner *)local_460);
                testing::Test::Check
                          (pTVar1,iVar5 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x202,"0 == cleaner1.cleaned_files_count()");
                pTVar1 = g_current_test;
                sVar10 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_);
                testing::Test::Check
                          (pTVar1,sVar10 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x203,"0u == fs_.files_removed_.size()");
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_480,"in",&local_481);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_480,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 != 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x204,"0 != fs_.Stat(\"in\", &err)");
                std::__cxx11::string::~string((string *)&local_480);
                std::allocator<char>::~allocator(&local_481);
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4a8,"out1",&local_4a9);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_4a8,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 != 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x205,"0 != fs_.Stat(\"out1\", &err)");
                std::__cxx11::string::~string((string *)&local_4a8);
                std::allocator<char>::~allocator(&local_4a9);
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4d0,"out2",(allocator<char> *)&cleaner2.field_0x97);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_4d0,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 != 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x206,"0 != fs_.Stat(\"out2\", &err)");
                std::__cxx11::string::~string((string *)&local_4d0);
                std::allocator<char>::~allocator((allocator<char> *)&cleaner2.field_0x97);
                Cleaner::Cleaner((Cleaner *)local_570,
                                 &(this->super_CleanDeadTest).super_CleanTest.
                                  super_StateTestWithBuiltinRules.state_,
                                 &(this->super_CleanDeadTest).super_CleanTest.config_,
                                 &(this->super_CleanDeadTest).super_CleanTest.fs_.
                                  super_DiskInterface);
                pTVar1 = g_current_test;
                pEVar7 = BuildLog::entries((BuildLog *)local_350);
                iVar5 = Cleaner::CleanDead((Cleaner *)local_570,pEVar7);
                testing::Test::Check
                          (pTVar1,iVar5 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x20a,"0 == cleaner2.CleanDead(log2.entries())");
                pTVar1 = g_current_test;
                iVar5 = Cleaner::cleaned_files_count((Cleaner *)local_570);
                testing::Test::Check
                          (pTVar1,iVar5 == 1,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x20b,"1 == cleaner2.cleaned_files_count()");
                pTVar1 = g_current_test;
                sVar10 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_);
                testing::Test::Check
                          (pTVar1,sVar10 == 1,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x20c,"1u == fs_.files_removed_.size()");
                pTVar1 = g_current_test;
                local_578._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_);
                pbVar12 = std::
                          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_578);
                bVar2 = std::operator==("out1",pbVar12);
                testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x20d,"\"out1\" == *(fs_.files_removed_.begin())");
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_598,"in",&local_599);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_598,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 != 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x20e,"0 != fs_.Stat(\"in\", &err)");
                std::__cxx11::string::~string((string *)&local_598);
                std::allocator<char>::~allocator(&local_599);
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5c0,"out1",&local_5c1);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_5c0,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x20f,"0 == fs_.Stat(\"out1\", &err)");
                std::__cxx11::string::~string((string *)&local_5c0);
                std::allocator<char>::~allocator(&local_5c1);
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5e8,"out2",&local_5e9);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_5e8,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 != 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x210,"0 != fs_.Stat(\"out2\", &err)");
                std::__cxx11::string::~string((string *)&local_5e8);
                std::allocator<char>::~allocator(&local_5e9);
                pTVar1 = g_current_test;
                pEVar7 = BuildLog::entries((BuildLog *)local_350);
                iVar5 = Cleaner::CleanDead((Cleaner *)local_570,pEVar7);
                testing::Test::Check
                          (pTVar1,iVar5 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x213,"0 == cleaner2.CleanDead(log2.entries())");
                pTVar1 = g_current_test;
                iVar5 = Cleaner::cleaned_files_count((Cleaner *)local_570);
                testing::Test::Check
                          (pTVar1,iVar5 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x214,"0 == cleaner2.cleaned_files_count()");
                pTVar1 = g_current_test;
                sVar10 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_);
                testing::Test::Check
                          (pTVar1,sVar10 == 1,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x215,"1u == fs_.files_removed_.size()");
                pTVar1 = g_current_test;
                local_5f8._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_);
                pbVar12 = std::
                          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_5f8);
                bVar2 = std::operator==("out1",pbVar12);
                testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x216,"\"out1\" == *(fs_.files_removed_.begin())");
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_618,"in",&local_619);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_618,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 != 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x217,"0 != fs_.Stat(\"in\", &err)");
                std::__cxx11::string::~string((string *)&local_618);
                std::allocator<char>::~allocator(&local_619);
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_640,"out1",&local_641);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_640,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x218,"0 == fs_.Stat(\"out1\", &err)");
                std::__cxx11::string::~string((string *)&local_640);
                std::allocator<char>::~allocator(&local_641);
                pTVar1 = g_current_test;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_668,"out2",&local_669);
                TVar11 = VirtualFileSystem::Stat
                                   (&(this->super_CleanDeadTest).super_CleanTest.fs_,&local_668,
                                    (string *)local_2c0);
                testing::Test::Check
                          (pTVar1,TVar11 != 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x219,"0 != fs_.Stat(\"out2\", &err)");
                std::__cxx11::string::~string((string *)&local_668);
                std::allocator<char>::~allocator(&local_669);
                BuildLog::Close((BuildLog *)local_350);
                Cleaner::~Cleaner((Cleaner *)local_570);
                Cleaner::~Cleaner((Cleaner *)local_460);
                local_138 = 0;
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                local_138 = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              local_138 = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_138 = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_138 = 1;
        }
        BuildLog::~BuildLog((BuildLog *)local_350);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_138 = 1;
      }
      std::__cxx11::string::~string((string *)local_2c0);
      BuildLog::~BuildLog((BuildLog *)((long)&err.field_2 + 8));
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_138 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_138 = 1;
  }
  State::~State((State *)local_118);
  return;
}

Assistant:

TEST_F(CleanDeadTest, CleanDead) {
  State state;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state,
"rule cat\n"
"  command = cat $in > $out\n"
"build out1: cat in\n"
"build out2: cat in\n"
));
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out2: cat in\n"
));
  fs_.Create("in", "");
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  BuildLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  log1.RecordCommand(state.edges_[0], 15, 18);
  log1.RecordCommand(state.edges_[1], 20, 25);
  log1.Close();

  BuildLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out1"));
  ASSERT_TRUE(log2.LookupByOutput("out2"));

  // First use the manifest that describe how to build out1.
  Cleaner cleaner1(&state, config_, &fs_);
  EXPECT_EQ(0, cleaner1.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner1.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_NE(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));

  // Then use the manifest that does not build out1 anymore.
  Cleaner cleaner2(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner2.CleanDead(log2.entries()));
  EXPECT_EQ(1, cleaner2.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());
  EXPECT_EQ("out1", *(fs_.files_removed_.begin()));
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));

  // Nothing to do now.
  EXPECT_EQ(0, cleaner2.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner2.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());
  EXPECT_EQ("out1", *(fs_.files_removed_.begin()));
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));
  log2.Close();
}